

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O0

RangeToken * __thiscall
xercesc_4_0::RangeTokenMap::getRange(RangeTokenMap *this,XMLCh *keyword,bool complement)

{
  TokenFactory *tokFactory;
  bool bVar1;
  uint uVar2;
  int iVar3;
  RangeTokenElemMap *this_00;
  undefined4 extraout_var;
  RangeFactory *pRVar4;
  RangeToken *tok;
  MemoryManager *manager;
  RangeFactory *rangeFactory;
  XMLCh *categName;
  uint categId;
  XMLMutexLock local_40;
  XMLMutexLock lockInit;
  RangeToken *rangeTok;
  RangeTokenElemMap *elemMap;
  bool complement_local;
  XMLCh *keyword_local;
  RangeTokenMap *this_local;
  
  bVar1 = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::containsKey
                    (this->fTokenRegistry,keyword);
  if (bVar1) {
    this_00 = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::get
                        (this->fTokenRegistry,keyword);
    lockInit.fToLock = (XMLMutex *)RangeTokenElemMap::getRangeToken(this_00,complement);
    if ((RangeToken *)lockInit.fToLock == (RangeToken *)0x0) {
      XMLMutexLock::XMLMutexLock(&local_40,&this->fMutex);
      lockInit.fToLock = (XMLMutex *)RangeTokenElemMap::getRangeToken(this_00,complement);
      if ((RangeToken *)lockInit.fToLock == (RangeToken *)0x0) {
        uVar2 = RangeTokenElemMap::getCategoryId(this_00);
        iVar3 = (*(this->fCategories->super_XSerializable)._vptr_XSerializable[10])
                          (this->fCategories,(ulong)uVar2);
        pRVar4 = RefHashTableOf<xercesc_4_0::RangeFactory,_xercesc_4_0::StringHasher>::get
                           (this->fRangeMap,(void *)CONCAT44(extraout_var,iVar3));
        if (pRVar4 != (RangeFactory *)0x0) {
          (*pRVar4->_vptr_RangeFactory[3])(pRVar4,this);
          lockInit.fToLock = (XMLMutex *)RangeTokenElemMap::getRangeToken(this_00,complement);
          if ((((RangeToken *)lockInit.fToLock == (RangeToken *)0x0) && (complement)) &&
             (tok = RangeTokenElemMap::getRangeToken(this_00,false),
             lockInit.fToLock = (XMLMutex *)tok, tok != (RangeToken *)0x0)) {
            tokFactory = this->fTokenFactory;
            manager = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::
                      getMemoryManager(this->fTokenRegistry);
            lockInit.fToLock = (XMLMutex *)RangeToken::complementRanges(tok,tokFactory,manager);
            RangeTokenElemMap::setRangeToken(this_00,(RangeToken *)lockInit.fToLock,complement);
          }
        }
      }
      XMLMutexLock::~XMLMutexLock(&local_40);
    }
    this_local = (RangeTokenMap *)lockInit.fToLock;
  }
  else {
    this_local = (RangeTokenMap *)0x0;
  }
  return (RangeToken *)this_local;
}

Assistant:

RangeToken* RangeTokenMap::getRange(const XMLCh* const keyword,
                                    const bool complement) {

    if (!fTokenRegistry->containsKey(keyword))
        return 0;

    RangeTokenElemMap* elemMap = fTokenRegistry->get(keyword);
    RangeToken* rangeTok = elemMap->getRangeToken(complement);

    if (!rangeTok)
    {
        XMLMutexLock lockInit(&fMutex);

        // make sure that it was not created while we were locked
        rangeTok = elemMap->getRangeToken(complement);

        if (!rangeTok)
        {
            unsigned int categId = elemMap->getCategoryId();
            const XMLCh* categName = fCategories->getValueForId(categId);
            RangeFactory* rangeFactory = fRangeMap->get(categName);

            if (rangeFactory)
            {
                rangeFactory->buildRanges(this);
                rangeTok = elemMap->getRangeToken(complement);

                // see if we are complementing an existing range
                if (!rangeTok && complement)
                {
                    rangeTok = elemMap->getRangeToken();
                    if (rangeTok)
                    {
                        rangeTok = RangeToken::complementRanges(rangeTok, fTokenFactory, fTokenRegistry->getMemoryManager());
                        elemMap->setRangeToken(rangeTok , complement);
                    }
                }
            }
        }
    }

    return rangeTok;
}